

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall helics::FederateInfo::loadJsonConfig(FederateInfo *this,JsonBuffer *jsonBuf)

{
  bool bVar1;
  json *jsonBuf_00;
  const_reference jref;
  FederateInfo *in_RSI;
  value_type *jbroker;
  value_type *prop;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
  timeCall;
  json *json;
  string *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  string *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  allocator<char> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd58;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  JsonBuffer local_210;
  string local_201;
  allocator<char> local_1d9 [40];
  allocator<char> local_1b1 [40];
  allocator<char> local_189 [33];
  function<void_(int,_int)> *in_stack_fffffffffffffe98;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffea0;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffea8;
  json *in_stack_fffffffffffffeb0;
  allocator<char> local_139 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  allocator<char> local_91 [33];
  const_iterator local_70;
  const_iterator local_68;
  const_iterator local_50;
  undefined1 *local_48;
  
  jsonBuf_00 = fileops::JsonBuffer::json_abi_cxx11_((JsonBuffer *)in_RSI);
  std::function<void(std::__cxx11::string_const&,TimeRepresentation<count_time<9,long>>)>::
  function<helics::FederateInfo::loadJsonConfig(helics::fileops::JsonBuffer_const&)::__0,void>
            ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
              *)in_stack_fffffffffffffd30,
             (anon_class_8_1_8991fb9c *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  local_48 = propStringsTranslations;
  local_50 = frozen::
             unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x404f48);
  local_68 = frozen::
             unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)0x404f6e);
  for (; local_50 != local_68; local_50 = local_50 + 1) {
    local_70 = local_50;
    if (local_50->second < 0xc9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      fileops::callIfMember
                ((json *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
                  *)in_stack_fffffffffffffd30);
      std::__cxx11::string::~string(in_stack_fffffffffffffd20);
      std::allocator<char>::~allocator(local_91);
    }
  }
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::FederateInfo::loadJsonConfig(helics::fileops::JsonBuffer_const&)::__1,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd30,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::FederateInfo::loadJsonConfig(helics::fileops::JsonBuffer_const&)::__2,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd30,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  std::function<void(int,int)>::
  function<helics::FederateInfo::loadJsonConfig(helics::fileops::JsonBuffer_const&)::__3,void>
            ((function<void_(int,_int)> *)in_stack_fffffffffffffd30,
             (anon_class_8_1_8991fb9c *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  processOptions(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe98);
  std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x405177);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x405184);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x405191);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd40,(char (*) [7])in_stack_fffffffffffffd38);
  if (bVar1) {
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50
              );
    fileops::replaceIfMember
              ((json *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30
              );
    std::__cxx11::string::~string(in_stack_fffffffffffffd20);
    std::allocator<char>::~allocator(local_139);
    in_stack_fffffffffffffd70 = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50
              );
    fileops::replaceIfMember
              ((json *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30
              );
    std::__cxx11::string::~string(in_stack_fffffffffffffd20);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9f);
    in_stack_fffffffffffffd68 = local_189;
    this_00 = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    fileops::replaceIfMember
              ((json *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30
              );
    std::__cxx11::string::~string(in_stack_fffffffffffffd20);
    std::allocator<char>::~allocator(local_189);
    __s = local_1b1;
    __a = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a);
    fileops::replaceIfMember
              ((json *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30
              );
    std::__cxx11::string::~string(in_stack_fffffffffffffd20);
    std::allocator<char>::~allocator(local_1b1);
    in_stack_fffffffffffffd40 = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a);
    fileops::replaceIfMember
              ((json *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(bool *)0x40541a);
    std::__cxx11::string::~string(in_stack_fffffffffffffd20);
    std::allocator<char>::~allocator(local_1d9);
    in_stack_fffffffffffffd38 = &local_201;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a);
    fileops::replaceIfMember
              ((json *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(int *)0x40548e);
    std::__cxx11::string::~string(in_stack_fffffffffffffd20);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffd40,(char (*) [7])in_stack_fffffffffffffd38);
  if (bVar1) {
    jref = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    fileops::JsonBuffer::JsonBuffer(&local_210,jref);
    loadJsonConfig(in_RSI,(JsonBuffer *)jsonBuf_00);
  }
  CLI::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
               *)0x40571e);
  return;
}

Assistant:

void FederateInfo::loadJsonConfig(const fileops::JsonBuffer& jsonBuf)
{
    const auto& json = jsonBuf.json();
    const std::function<void(const std::string&, Time)> timeCall = [this](const std::string& fname,
                                                                          Time arg) {
        setProperty(propStringsTranslations.at(fname), arg);
    };

    for (const auto& prop : propStringsTranslations) {
        if (prop.second > 200) {
            continue;
        }
        fileops::callIfMember(json, std::string(prop.first), timeCall);
    }

    processOptions(
        json,
        [](const std::string& option) { return getFlagIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [this](int32_t option, int32_t value) { setFlagOption(option, value != 0); });

    if (json.contains("broker")) {
        const auto& jbroker = json["broker"];
        fileops::replaceIfMember(jbroker, "name", broker);
        fileops::replaceIfMember(jbroker, "host", broker);
        fileops::replaceIfMember(jbroker, "initstring", brokerInitString);
        fileops::replaceIfMember(jbroker, "key", key);
        fileops::replaceIfMember(jbroker, "auto", autobroker);
        fileops::replaceIfMember(jbroker, "port", brokerPort);
    }

    if (json.contains("helics")) {
        loadJsonConfig(json["helics"]);
    }
}